

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O0

void __thiscall hgdb::json::SymbolTable::compress_var(SymbolTable *this)

{
  bool bVar1;
  size_type __n;
  reference ppVar2;
  reference puVar3;
  pointer pMVar4;
  pair<std::__detail::_Node_iterator<std::pair<const_hgdb::json::Variable,_unsigned_long>,_false,_true>,_bool>
  pVar5;
  unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_> *m_1;
  iterator __end2_2;
  iterator __begin2_2;
  vector<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
  *__range2_2;
  VarAssign var_assign;
  _Storage<unsigned_long,_true> local_160;
  undefined8 uStack_158;
  Variable *local_150;
  value_type *var_id;
  size_type id;
  type *c;
  type *var;
  _Node_iterator_base<std::pair<const_hgdb::json::Variable,_unsigned_long>,_true> local_d0;
  iterator __end2_1;
  iterator __begin2_1;
  unordered_map<hgdb::json::Variable,_unsigned_long,_hgdb::json::Variable::hash_fn,_std::equal_to<hgdb::json::Variable>,_std::allocator<std::pair<const_hgdb::json::Variable,_unsigned_long>_>_>
  *__range2_1;
  unordered_map<hgdb::json::Variable,_unsigned_long,_hgdb::json::Variable::hash_fn,_std::equal_to<hgdb::json::Variable>,_std::allocator<std::pair<const_hgdb::json::Variable,_unsigned_long>_>_>
  ids;
  unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_> *m;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
  *__range2;
  VariableCount v_count;
  SymbolTable *this_local;
  
  v_count.count._M_h._M_single_bucket = (__node_base_ptr)this;
  VariableCount::VariableCount((VariableCount *)&__range2);
  __end2 = std::
           vector<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
           ::begin(&this->modules_);
  m = (unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_> *)
      std::
      vector<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
      ::end(&this->modules_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_*,_std::vector<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>_>
                                *)&m);
    if (!bVar1) break;
    puVar3 = __gnu_cxx::
             __normal_iterator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_*,_std::vector<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>_>
             ::operator*(&__end2);
    pMVar4 = std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>::get
                       (puVar3);
    ScopeVisitor::visit((ScopeVisitor *)&__range2,(ScopeBase *)pMVar4);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_*,_std::vector<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>_>
    ::operator++(&__end2);
  }
  __n = std::
        unordered_map<hgdb::json::Variable,_unsigned_long,_hgdb::json::Variable::hash_fn,_std::equal_to<hgdb::json::Variable>,_std::allocator<std::pair<const_hgdb::json::Variable,_unsigned_long>_>_>
        ::size((unordered_map<hgdb::json::Variable,_unsigned_long,_hgdb::json::Variable::hash_fn,_std::equal_to<hgdb::json::Variable>,_std::allocator<std::pair<const_hgdb::json::Variable,_unsigned_long>_>_>
                *)&v_count);
  std::vector<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_>::reserve
            (&this->variables_,__n);
  std::
  unordered_map<hgdb::json::Variable,_unsigned_long,_hgdb::json::Variable::hash_fn,_std::equal_to<hgdb::json::Variable>,_std::allocator<std::pair<const_hgdb::json::Variable,_unsigned_long>_>_>
  ::unordered_map((unordered_map<hgdb::json::Variable,_unsigned_long,_hgdb::json::Variable::hash_fn,_std::equal_to<hgdb::json::Variable>,_std::allocator<std::pair<const_hgdb::json::Variable,_unsigned_long>_>_>
                   *)&__range2_1);
  __end2_1 = std::
             unordered_map<hgdb::json::Variable,_unsigned_long,_hgdb::json::Variable::hash_fn,_std::equal_to<hgdb::json::Variable>,_std::allocator<std::pair<const_hgdb::json::Variable,_unsigned_long>_>_>
             ::begin((unordered_map<hgdb::json::Variable,_unsigned_long,_hgdb::json::Variable::hash_fn,_std::equal_to<hgdb::json::Variable>,_std::allocator<std::pair<const_hgdb::json::Variable,_unsigned_long>_>_>
                      *)&v_count);
  local_d0._M_cur =
       (__node_type *)
       std::
       unordered_map<hgdb::json::Variable,_unsigned_long,_hgdb::json::Variable::hash_fn,_std::equal_to<hgdb::json::Variable>,_std::allocator<std::pair<const_hgdb::json::Variable,_unsigned_long>_>_>
       ::end((unordered_map<hgdb::json::Variable,_unsigned_long,_hgdb::json::Variable::hash_fn,_std::equal_to<hgdb::json::Variable>,_std::allocator<std::pair<const_hgdb::json::Variable,_unsigned_long>_>_>
              *)&v_count);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end2_1.
                        super__Node_iterator_base<std::pair<const_hgdb::json::Variable,_unsigned_long>,_true>
                       ,&local_d0);
    if (!bVar1) break;
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_hgdb::json::Variable,_unsigned_long>,_false,_true>::
             operator*(&__end2_1);
    std::pair<const_hgdb::json::Variable,_unsigned_long>::pair
              ((pair<const_hgdb::json::Variable,_unsigned_long> *)&var,ppVar2);
    c = (type *)std::get<0ul,hgdb::json::Variable_const,unsigned_long>
                          ((pair<const_hgdb::json::Variable,_unsigned_long> *)&var);
    id = (size_type)
         std::get<1ul,hgdb::json::Variable_const,unsigned_long>
                   ((pair<const_hgdb::json::Variable,_unsigned_long> *)&var);
    if (1 < *(ulong *)id) {
      var_id = (value_type *)
               std::vector<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_>::size
                         (&this->variables_);
      local_150 = std::vector<hgdb::json::Variable,std::allocator<hgdb::json::Variable>>::
                  emplace_back<hgdb::json::Variable_const&>
                            ((vector<hgdb::json::Variable,std::allocator<hgdb::json::Variable>> *)
                             &this->variables_,(Variable *)c);
      std::optional<unsigned_long>::optional<unsigned_long_&,_true>
                ((optional<unsigned_long> *)&local_160,(unsigned_long *)&var_id);
      (local_150->id).super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload = local_160;
      *(undefined8 *)
       &(local_150->id).super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_engaged = uStack_158;
      pVar5 = std::
              unordered_map<hgdb::json::Variable,unsigned_long,hgdb::json::Variable::hash_fn,std::equal_to<hgdb::json::Variable>,std::allocator<std::pair<hgdb::json::Variable_const,unsigned_long>>>
              ::emplace<hgdb::json::Variable&,unsigned_long&>
                        ((unordered_map<hgdb::json::Variable,unsigned_long,hgdb::json::Variable::hash_fn,std::equal_to<hgdb::json::Variable>,std::allocator<std::pair<hgdb::json::Variable_const,unsigned_long>>>
                          *)&__range2_1,local_150,(unsigned_long *)&var_id);
      var_assign.id_ =
           (unordered_map<hgdb::json::Variable,_unsigned_long,_hgdb::json::Variable::hash_fn,_std::equal_to<hgdb::json::Variable>,_std::allocator<std::pair<const_hgdb::json::Variable,_unsigned_long>_>_>
            *)pVar5.first.
              super__Node_iterator_base<std::pair<const_hgdb::json::Variable,_unsigned_long>,_true>.
              _M_cur;
    }
    std::pair<const_hgdb::json::Variable,_unsigned_long>::~pair
              ((pair<const_hgdb::json::Variable,_unsigned_long> *)&var);
    std::__detail::_Node_iterator<std::pair<const_hgdb::json::Variable,_unsigned_long>,_false,_true>
    ::operator++(&__end2_1);
  }
  VarAssign::VarAssign
            ((VarAssign *)&__range2_2,
             (unordered_map<hgdb::json::Variable,_unsigned_long,_hgdb::json::Variable::hash_fn,_std::equal_to<hgdb::json::Variable>,_std::allocator<std::pair<const_hgdb::json::Variable,_unsigned_long>_>_>
              *)&__range2_1);
  __end2_2 = std::
             vector<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
             ::begin(&this->modules_);
  m_1 = (unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_> *)
        std::
        vector<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
        ::end(&this->modules_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_2,
                       (__normal_iterator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_*,_std::vector<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>_>
                        *)&m_1);
    if (!bVar1) break;
    puVar3 = __gnu_cxx::
             __normal_iterator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_*,_std::vector<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>_>
             ::operator*(&__end2_2);
    pMVar4 = std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>::get
                       (puVar3);
    ScopeVisitor::visit((ScopeVisitor *)&__range2_2,(ScopeBase *)pMVar4);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_*,_std::vector<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>_>
    ::operator++(&__end2_2);
  }
  std::
  unordered_map<hgdb::json::Variable,_unsigned_long,_hgdb::json::Variable::hash_fn,_std::equal_to<hgdb::json::Variable>,_std::allocator<std::pair<const_hgdb::json::Variable,_unsigned_long>_>_>
  ::~unordered_map((unordered_map<hgdb::json::Variable,_unsigned_long,_hgdb::json::Variable::hash_fn,_std::equal_to<hgdb::json::Variable>,_std::allocator<std::pair<const_hgdb::json::Variable,_unsigned_long>_>_>
                    *)&__range2_1);
  VariableCount::~VariableCount((VariableCount *)&__range2);
  return;
}

Assistant:

void compress_var() {
        // first pass collect all the variables
        VariableCount v_count;
        for (auto &m : modules_) {
            v_count.visit(m.get());
        }
        // compute the global variable pull
        variables_.reserve(v_count.count.size());
        std::unordered_map<Variable, uint64_t, Variable::hash_fn> ids;
        for (auto [var, c] : v_count.count) {
            if (c > 1) {
                auto id = variables_.size();
                auto &var_id = variables_.emplace_back(var);
                var_id.id = id;
                ids.emplace(var_id, id);
            }
        }

        // second pass to assign
        VarAssign var_assign(ids);
        for (auto &m : modules_) {
            var_assign.visit(m.get());
        }
    }